

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

bool __thiscall ON_Viewport::SetFrustumNearFar(ON_Viewport *this,double *center,double radius)

{
  bool bVar1;
  double dVar2;
  double x;
  double local_a8;
  double P [3];
  double local_88;
  double camZ [3];
  double local_68;
  double camLoc [3];
  double d;
  double f;
  double n;
  bool rc;
  double radius_local;
  double *center_local;
  ON_Viewport *this_local;
  
  n._7_1_ = false;
  if ((((center != (double *)0x0) && (bVar1 = ON_IsValid(*center), bVar1)) &&
      (bVar1 = ON_IsValid(center[1]), bVar1)) &&
     ((bVar1 = ON_IsValid(center[2]), bVar1 && (bVar1 = ON_IsValid(radius), bVar1)))) {
    bVar1 = GetCameraFrame(this,&local_68,(double *)0x0,(double *)0x0,&local_88);
    if (bVar1) {
      dVar2 = ABS(radius);
      local_a8 = dVar2 * local_88 + *center;
      P[0] = dVar2 * local_88 + center[1];
      P[1] = dVar2 * local_88 + center[2];
      x = clipDist(&local_68,&local_88,&local_a8);
      local_a8 = -dVar2 * local_88 + *center;
      P[0] = -dVar2 * local_88 + center[1];
      P[1] = -dVar2 * local_88 + center[2];
      dVar2 = clipDist(&local_68,&local_88,&local_a8);
      bVar1 = ON_IsValid(dVar2);
      if ((!bVar1) || (bVar1 = ON_IsValid(x), !bVar1)) {
        return false;
      }
      if (dVar2 <= 0.0) {
        return false;
      }
      f = x * 0.9375;
      dVar2 = dVar2 * 1.0625;
      if (f <= 0.0) {
        f = this->m__MIN_NEAR_OVER_FAR * dVar2;
      }
      bVar1 = IsPerspectiveProjection(this);
      if (bVar1) {
        n._7_1_ = SetFrustumNearFar(this,f,dVar2,this->m__MIN_NEAR_DIST,this->m__MIN_NEAR_OVER_FAR,
                                    (f + dVar2) * 0.5);
      }
      else {
        n._7_1_ = SetFrustumNearFar(this,f,dVar2);
      }
    }
    return n._7_1_;
  }
  return false;
}

Assistant:

bool ON_Viewport::SetFrustumNearFar( 
       const double* center,
       double        radius
       )
{
  bool rc = false;
  double n, f, d;
  double camLoc[3], camZ[3], P[3];

  if ( !center 
       || !ON_IsValid(center[0]) 
       || !ON_IsValid(center[1]) 
       || !ON_IsValid(center[2])
       || !ON_IsValid(radius)
     )
  {
    return false;
  }

  if ( GetCameraFrame( camLoc, nullptr, nullptr, camZ ) ) 
  {
    d = fabs(radius);
    P[0] = center[0] + d*camZ[0];
    P[1] = center[1] + d*camZ[0];
    P[2] = center[2] + d*camZ[0];
    n = clipDist(camLoc,camZ,P);
    P[0] = center[0] - d*camZ[0];
    P[1] = center[1] - d*camZ[0];
    P[2] = center[2] - d*camZ[0];
    f = clipDist(camLoc,camZ,P);
    if ( !ON_IsValid(f) || !ON_IsValid(n) )
      return false;
    if ( f <= 0.0 )
      return false; // sphere is behind camera
    n *= 0.9375;
    f *= 1.0625;
    if ( n <= 0.0 )
      n = m__MIN_NEAR_OVER_FAR*f;
    if ( IsPerspectiveProjection() )
      rc = SetFrustumNearFar( n, f, m__MIN_NEAR_DIST, m__MIN_NEAR_OVER_FAR, 0.5*(n+f) );
    else
      rc = SetFrustumNearFar( n, f );
  }
  return rc;
}